

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

void print_stats(solver_t *s)

{
  solver_t *s_local;
  
  printf("starts        : %10d\n",(ulong)(s->stats).n_starts);
  printf("conflicts     : %10ld\n",(s->stats).n_conflicts);
  printf("decisions     : %10ld\n",(s->stats).n_decisions);
  printf("propagations  : %10ld\n",(s->stats).n_propagations);
  return;
}

Assistant:

static void
print_stats(FILE *f, struct saucy_stats stats )
{
    fprintf(f, "group size = %fe%d\n",
        stats.grpsize_base, stats.grpsize_exp);
    fprintf(f, "levels = %d\n", stats.levels);
    fprintf(f, "nodes = %d\n", stats.nodes);
    fprintf(f, "generators = %d\n", stats.gens);
    fprintf(f, "total support = %d\n", stats.support);
    fprintf(f, "average support = %.2f\n",(double)(stats.support)/(double)(stats.gens));
    fprintf(f, "nodes per generator = %.2f\n",(double)(stats.nodes)/(double)(stats.gens));
    fprintf(f, "bad nodes = %d\n", stats.bads);
}